

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Customer.cpp
# Opt level: O0

VegetarianCustomer * __thiscall VegetarianCustomer::toString_abi_cxx11_(VegetarianCustomer *this)

{
  undefined1 local_38 [40];
  VegetarianCustomer *this_local;
  
  this_local = this;
  Customer::getName_abi_cxx11_((Customer *)local_38);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

std::string VegetarianCustomer::toString() const
{
    return getName() + ",veg ";
}